

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCoro.hpp
# Opt level: O2

anon_enum_32
SCoro::Poll<SCoro::SCoro<Initial,RecordTime,WaitForExpiry,PrintPollAttempts,RecordTime>>
          (SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime> *obj)

{
  Result RVar1;
  ulong uVar2;
  
  RVar1 = (*Impl::
            GetImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>_>
            ::lut[(obj->super_EboIndex<5UL>).index])(obj);
  if (RVar1.value != Yield) {
    if (RVar1.value == Next) {
      uVar2 = (obj->super_EboIndex<5UL>).index + 1;
      (obj->super_EboIndex<5UL>).index = uVar2;
      RVar1.value = (uint)(uVar2 < 5) * 2;
    }
    else {
      RVar1.value = End;
    }
  }
  return RVar1.value;
}

Assistant:

constexpr auto Poll(Obj & obj) noexcept
    {
        switch (Impl::get(obj)(obj).value)
        {
        case Result::Next:
            return obj.Next() < obj.count ? Result::Next : Result::End;
        case Result::Yield:
            return Result::Yield;    
        default:
            return Result::End;
        }
    }